

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-create-socket-early.c
# Opt level: O2

int run_test_udp_create_early_bad_domain(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  uv_udp_t client;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_udp_init_ex(puVar2,&client,0x2f);
  if (iVar1 == -0x16) {
    puVar2 = uv_default_loop();
    iVar1 = uv_udp_init_ex(puVar2,&client,0x400);
    if (iVar1 == -0x16) {
      puVar2 = uv_default_loop();
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      close_loop(puVar2);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      pcVar4 = "0 == uv_loop_close(uv_default_loop())";
      uVar3 = 0x85;
    }
    else {
      pcVar4 = "r == UV_EINVAL";
      uVar3 = 0x81;
    }
  }
  else {
    pcVar4 = "r == UV_EINVAL";
    uVar3 = 0x7e;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-create-socket-early.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(udp_create_early_bad_domain) {
  uv_udp_t client;
  int r;

  r = uv_udp_init_ex(uv_default_loop(), &client, 47);
  ASSERT(r == UV_EINVAL);

  r = uv_udp_init_ex(uv_default_loop(), &client, 1024);
  ASSERT(r == UV_EINVAL);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}